

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall
cmCursesMainForm::FixValue(cmCursesMainForm *this,CacheEntryType type,string *in,string *out)

{
  bool bVar1;
  char *pcVar2;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::find_last_not_of((char *)in,0x4bd3b7,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_40,(ulong)in);
  std::__cxx11::string::operator=((string *)out,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (type - PATH < 2) {
    cmsys::SystemTools::ConvertToUnixSlashes(out);
  }
  else if (type == BOOL) {
    bVar1 = cmSystemTools::IsOff((out->_M_dataplus)._M_p);
    if (bVar1) {
      pcVar2 = "OFF";
    }
    else {
      pcVar2 = "ON";
    }
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,(ulong)pcVar2);
  }
  return;
}

Assistant:

void cmCursesMainForm::FixValue(cmState::CacheEntryType type,
                                const std::string& in, std::string& out) const
{
  out = in.substr(0,in.find_last_not_of(" ")+1);
  if(type == cmState::PATH || type == cmState::FILEPATH)
    {
    cmSystemTools::ConvertToUnixSlashes(out);
    }
  if(type == cmState::BOOL)
    {
    if(cmSystemTools::IsOff(out.c_str()))
      {
      out = "OFF";
      }
    else
      {
      out = "ON";
      }
    }
}